

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O0

void show_combined_generic
               (renderer_info *info,ui_entry_details *details,wchar_t vcombined,wchar_t acombined)

{
  undefined1 local_44 [8];
  ui_entry_details combined_details;
  wchar_t acombined_local;
  wchar_t vcombined_local;
  ui_entry_details *details_local;
  renderer_info *info_local;
  
  combined_details.combined_position.y = acombined;
  combined_details._32_4_ = vcombined;
  local_44 = (undefined1  [8])loc(0,0);
  combined_details.label_position = details->combined_position;
  combined_details.value_position = (loc_conflict)loc(0,0);
  combined_details.position_step = (loc_conflict)loc(0,0);
  combined_details.combined_position.x._0_1_ = 0;
  combined_details.combined_position.x._1_1_ = 0;
  combined_details.combined_position.x._2_1_ = details->known_rune & 1;
  combined_details.combined_position.x._3_1_ = 0;
  ui_entry_renderer_apply
            (info->combined_renderer_index,(wchar_t *)0x0,L'\0',
             (wchar_t *)&combined_details.vertical_label,&combined_details.combined_position.y,
             L'\x01',(ui_entry_details *)local_44);
  return;
}

Assistant:

static void show_combined_generic(const struct renderer_info *info,
	const struct ui_entry_details *details, int vcombined, int acombined)
{
	struct ui_entry_details combined_details;

	combined_details.label_position = loc(0, 0);
	combined_details.value_position = details->combined_position;
	combined_details.position_step = loc(0, 0);
	combined_details.combined_position = loc(0, 0);
	combined_details.vertical_label = false;
	combined_details.alternate_color_first = false;
	combined_details.known_rune = details->known_rune;
	combined_details.show_combined = false;
	ui_entry_renderer_apply(info->combined_renderer_index, NULL,
		0, &vcombined, &acombined, 1, &combined_details);
}